

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O3

uint32_t __thiscall
CompressedArray::calculate_key_size(CompressedArray *this,Key key,Key prev_key,bool same_word)

{
  uint32_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000009;
  int iVar5;
  
  iVar5 = 0;
  if ((int)CONCAT71(in_register_00000009,same_word) == 0) {
    uVar1 = this->word_index_diff_log_radix;
    iVar5 = -uVar1;
    iVar3 = 0;
    do {
      bVar2 = (byte)iVar3;
      iVar5 = iVar5 + uVar1 + 1;
      iVar3 = iVar3 + uVar1;
    } while (key.word_index - prev_key.word_index >> (bVar2 & 0x3f) != 0);
  }
  if (key.word_index == prev_key.word_index) {
    uVar1 = this->context_index_diff_log_radix;
    iVar3 = -uVar1;
    iVar4 = 0;
    do {
      bVar2 = (byte)iVar4;
      iVar3 = iVar3 + uVar1 + 1;
      iVar4 = iVar4 + uVar1;
    } while (key.context_index - prev_key.context_index >> (bVar2 & 0x3f) != 0);
  }
  else {
    uVar1 = this->context_index_log_radix;
    iVar3 = -uVar1;
    iVar4 = 0;
    do {
      bVar2 = (byte)iVar4;
      iVar3 = iVar3 + uVar1 + 1;
      iVar4 = iVar4 + uVar1;
    } while (((ulong)key >> 0x20) >> (bVar2 & 0x3f) != 0);
  }
  return iVar3 + iVar5;
}

Assistant:

uint32_t CompressedArray::calculate_key_size(Key key, Key prev_key, bool same_word) const {
    uint32_t size = 0;
    if (!same_word)
        size += calculate_number_size(key.word_index - prev_key.word_index,
                                      word_index_diff_log_radix);
    if (key.word_index == prev_key.word_index)
        size += calculate_number_size(key.context_index - prev_key.context_index,
                                      context_index_diff_log_radix);
    else
        size += calculate_number_size(key.context_index, context_index_log_radix);
    return size;
}